

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDecoder.cpp
# Opt level: O0

int ZXing::Pdf417::ProcessECI
              (vector<int,_std::allocator<int>_> *codewords,int codeIndex,int length,int code,
              Content *result)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Content *in_R8;
  Content *this;
  int local_c;
  
  local_c = in_ESI;
  if ((in_ESI < in_EDX) && (bVar1 = IsECI(in_ECX), bVar1)) {
    if (in_ECX == 0x39f) {
      local_c = in_ESI + 1;
      this = in_R8;
      std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
      Content::switchEncoding(this,(ECI)((ulong)in_R8 >> 0x20));
    }
    else {
      local_c = 1;
      if (in_ECX == 0x39e) {
        local_c = 2;
      }
      local_c = local_c + in_ESI;
    }
  }
  return local_c;
}

Assistant:

static int ProcessECI(const std::vector<int>& codewords, int codeIndex, const int length, const int code, Content& result)
{
	if (codeIndex < length && IsECI(code)) {
		if (code == ECI_CHARSET)
			result.switchEncoding(ECI(codewords[codeIndex++]));
		else
			codeIndex += code == ECI_GENERAL_PURPOSE ? 2 : 1; // Don't currently handle non-character set ECIs so just ignore
	}

	return codeIndex;
}